

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CS248::Application::mouse_released(Application *this,e_mouse_button b)

{
  if (b == MIDDLE) {
    this->middleDown = false;
  }
  else {
    if (b == RIGHT) {
      this->rightDown = false;
      return;
    }
    if (b == LEFT) {
      this->leftDown = false;
      return;
    }
  }
  return;
}

Assistant:

void Application::mouse_released(e_mouse_button b) {
    switch (b) {
      case LEFT:
        leftDown = false;
        break;
      case RIGHT:
        rightDown = false;
        break;
      case MIDDLE:
        middleDown = false;
        break;
    }
}